

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddEssent.c
# Opt level: O0

DdTlcInfo * Cudd_FindTwoLiteralClauses(DdManager *dd,DdNode *f)

{
  int iVar1;
  int local_50;
  int i;
  int size;
  DdNode *node;
  DdTlcInfo *tlc;
  st__generator *gen;
  st__table *table;
  DdTlcInfo *res;
  DdNode *f_local;
  DdManager *dd_local;
  
  iVar1 = dd->size;
  res = (DdTlcInfo *)f;
  f_local = &dd->sentinel;
  if (*(int *)((ulong)f & 0xfffffffffffffffe) == 0x7fffffff) {
    dd_local = (DdManager *)emptyClauseSet();
  }
  else {
    gen = (st__generator *)st__init_table(st__ptrcmp,st__ptrhash);
    if ((st__table *)gen == (st__table *)0x0) {
      dd_local = (DdManager *)0x0;
    }
    else {
      Tolv = bitVectorAlloc(iVar1);
      if (Tolv == (BitVector *)0x0) {
        st__free_table((st__table *)gen);
        dd_local = (DdManager *)0x0;
      }
      else {
        Tolp = bitVectorAlloc(iVar1);
        if (Tolp == (BitVector *)0x0) {
          st__free_table((st__table *)gen);
          bitVectorFree(Tolv);
          dd_local = (DdManager *)0x0;
        }
        else {
          Eolv = bitVectorAlloc(iVar1);
          if (Eolv == (BitVector *)0x0) {
            st__free_table((st__table *)gen);
            bitVectorFree(Tolv);
            bitVectorFree(Tolp);
            dd_local = (DdManager *)0x0;
          }
          else {
            Eolp = bitVectorAlloc(iVar1);
            if (Eolp == (BitVector *)0x0) {
              st__free_table((st__table *)gen);
              bitVectorFree(Tolv);
              bitVectorFree(Tolp);
              bitVectorFree(Eolv);
              dd_local = (DdManager *)0x0;
            }
            else {
              table = (st__table *)
                      ddFindTwoLiteralClausesRecur
                                ((DdManager *)f_local,(DdNode *)res,(st__table *)gen);
              tlc = (DdTlcInfo *)st__init_gen((st__table *)gen);
              while (iVar1 = st__gen((st__generator *)tlc,(char **)&i,(char **)&node), iVar1 != 0) {
                if (_i != res) {
                  Cudd_tlcInfoFree((DdTlcInfo *)node);
                }
              }
              st__free_gen((st__generator *)tlc);
              st__free_table((st__table *)gen);
              bitVectorFree(Tolv);
              bitVectorFree(Tolp);
              bitVectorFree(Eolv);
              bitVectorFree(Eolp);
              if (table != (st__table *)0x0) {
                local_50 = 0;
                while (iVar1 = sentinelp(*(DdHalfWord *)(table->compare + (long)local_50 * 4),
                                         *(DdHalfWord *)(table->compare + (long)(local_50 + 1) * 4))
                      , iVar1 == 0) {
                  local_50 = local_50 + 2;
                }
                table->num_bins = local_50 >> 1;
              }
              dd_local = (DdManager *)table;
            }
          }
        }
      }
    }
  }
  return (DdTlcInfo *)dd_local;
}

Assistant:

DdTlcInfo *
Cudd_FindTwoLiteralClauses(
  DdManager * dd,
  DdNode * f)
{
    DdTlcInfo *res;
    st__table *table;
    st__generator *gen;
    DdTlcInfo *tlc;
    DdNode *node;
    int size = dd->size;

    if (Cudd_IsConstant(f)) {
        res = emptyClauseSet();
        return(res);
    }
    table = st__init_table( st__ptrcmp, st__ptrhash);
    if (table == NULL) return(NULL);
    Tolv = bitVectorAlloc(size);
    if (Tolv == NULL) {
        st__free_table(table);
        return(NULL);
    }
    Tolp = bitVectorAlloc(size);
    if (Tolp == NULL) {
        st__free_table(table);
        bitVectorFree(Tolv);
        return(NULL);
    }
    Eolv = bitVectorAlloc(size);
    if (Eolv == NULL) {
        st__free_table(table);
        bitVectorFree(Tolv);
        bitVectorFree(Tolp);
        return(NULL);
    }
    Eolp = bitVectorAlloc(size);
    if (Eolp == NULL) {
        st__free_table(table);
        bitVectorFree(Tolv);
        bitVectorFree(Tolp);
        bitVectorFree(Eolv);
        return(NULL);
    }

    res = ddFindTwoLiteralClausesRecur(dd,f,table);
    /* Dispose of table contents and free table. */
    st__foreach_item(table, gen, (const char **)&node, (char **)&tlc) {
        if (node != f) {
            Cudd_tlcInfoFree(tlc);
        }
    }
    st__free_table(table);
    bitVectorFree(Tolv);
    bitVectorFree(Tolp);
    bitVectorFree(Eolv);
    bitVectorFree(Eolp);

    if (res != NULL) {
        int i;
        for (i = 0; !sentinelp(res->vars[i], res->vars[i+1]); i += 2);
        res->cnt = i >> 1;
    }

    return(res);

}